

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O3

intptr_t mock_(TestReporter *test_reporter,char *function,char *mock_file,int mock_line,
              char *parameters,...)

{
  char cVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  void *__src;
  size_t __size;
  CgreenValue CVar4;
  CgreenValue CVar5;
  CgreenValue value;
  char in_AL;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  RecordedExpectation *pRVar12;
  CgreenVector *vector;
  CgreenVector *vector_00;
  intptr_t *piVar13;
  CgreenValue *item;
  CgreenVector *pCVar14;
  char *pcVar15;
  undefined4 *puVar16;
  char *pcVar17;
  int *piVar18;
  char *__s1;
  Constraint *pCVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double dVar22;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list actuals;
  CgreenValue actual;
  undefined1 local_158 [16];
  size_t local_148;
  char *local_138;
  char *local_130;
  ulong local_128;
  intptr_t *local_120;
  undefined1 *local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  size_t local_f8;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_130 = mock_file;
  local_c0 = in_R9;
  iVar7 = cgreen_vector_size(global_expectation_queue);
  pRVar12 = (RecordedExpectation *)0x0;
  if (0 < iVar7) {
    iVar7 = 0;
    do {
      pRVar12 = (RecordedExpectation *)cgreen_vector_get(global_expectation_queue,iVar7);
      iVar8 = strcmp(pRVar12->function,function);
      if (iVar8 == 0) break;
      iVar7 = iVar7 + 1;
      iVar8 = cgreen_vector_size(global_expectation_queue);
      pRVar12 = (RecordedExpectation *)0x0;
    } while (iVar7 < iVar8);
  }
  local_138 = function;
  vector = create_vector_of_names(parameters);
  local_128 = 0x3000000028;
  local_120 = (intptr_t *)&stack0x00000008;
  local_118 = local_e8;
  cVar1 = *parameters;
  if (cVar1 != '\0') {
    pcVar15 = parameters + 1;
    iVar7 = 1;
    do {
      if (cVar1 == ',') {
        iVar7 = iVar7 + 1;
      }
      else if (cVar1 == '\0') goto LAB_0010a419;
      cVar1 = *pcVar15;
      pcVar15 = pcVar15 + 1;
    } while( true );
  }
  vector_00 = create_cgreen_vector(free);
LAB_0010a4ad:
  pCVar14 = create_vector_of_double_markers_for(parameters);
  iVar7 = cgreen_vector_size(pCVar14);
  if (0 < iVar7) {
    iVar7 = 0;
    do {
      pcVar15 = (char *)cgreen_vector_get(pCVar14,iVar7);
      if (*pcVar15 == '\x01') {
        puVar16 = (undefined4 *)cgreen_vector_get(vector_00,iVar7);
        uVar2 = puVar16[1];
        uVar3 = *(undefined8 *)(puVar16 + 4);
        dVar22 = unbox_double(*(intptr_t *)(puVar16 + 2));
        *puVar16 = 2;
        puVar16[1] = uVar2;
        *(double *)(puVar16 + 2) = dVar22;
        *(undefined8 *)(puVar16 + 4) = uVar3;
      }
      iVar7 = iVar7 + 1;
      iVar8 = cgreen_vector_size(pCVar14);
    } while (iVar7 < iVar8);
  }
  destroy_cgreen_vector(pCVar14);
  pcVar15 = local_138;
  if (pRVar12 == (RecordedExpectation *)0x0) {
    if (cgreen_mocks_are_ == strict_mocks) {
      pCVar14 = create_cgreen_vector(destroy_constraint);
      pRVar12 = create_recorded_expectation(pcVar15,local_130,mock_line,pCVar14);
      pcVar15 = pRVar12->function;
      iVar7 = cgreen_vector_size(successfully_mocked_calls);
      pcVar17 = "Mocked function [%s] did not have an expectation that it would be called";
      if (0 < iVar7) {
        iVar7 = 0;
        do {
          __s1 = (char *)cgreen_vector_get(successfully_mocked_calls,iVar7);
          iVar8 = strcmp(__s1,pcVar15);
          if (iVar8 == 0) {
            pcVar17 = "Mocked function [%s] was called too many times";
            break;
          }
          iVar7 = iVar7 + 1;
          iVar8 = cgreen_vector_size(successfully_mocked_calls);
        } while (iVar7 < iVar8);
      }
      (*test_reporter->assert_true)
                (test_reporter,current_test->filename,current_test->line,0,pcVar17,pcVar15);
      destroy_cgreen_vector(pRVar12->constraints);
      free(pRVar12);
    }
    else if (cgreen_mocks_are_ == learning_mocks) {
      pCVar14 = create_cgreen_vector(destroy_constraint);
      iVar7 = cgreen_vector_size(vector);
      if (0 < iVar7) {
        iVar7 = 0;
        do {
          pcVar17 = (char *)cgreen_vector_get(vector,iVar7);
          piVar18 = (int *)cgreen_vector_get(vector_00,iVar7);
          if (*piVar18 == 2) {
            pCVar19 = create_equal_to_double_constraint(*(double *)(piVar18 + 2),pcVar17);
          }
          else {
            pCVar19 = create_equal_to_value_constraint((intptr_t)*(double *)(piVar18 + 2),pcVar17);
          }
          cgreen_vector_add(pCVar14,pCVar19);
          iVar7 = iVar7 + 1;
          iVar8 = cgreen_vector_size(vector);
        } while (iVar7 < iVar8);
      }
      pRVar12 = create_recorded_expectation(pcVar15,local_130,mock_line,pCVar14);
      if (learned_mock_calls == (CgreenVector *)0x0) {
        learned_mock_calls = create_cgreen_vector((_func_void_void_ptr *)0x0);
      }
      cgreen_vector_add(learned_mock_calls,pRVar12);
    }
    destroy_cgreen_vector(vector_00);
    destroy_cgreen_vector(vector);
    pcVar15 = (char *)0x0;
  }
  else if (pRVar12->time_to_live == -0xf314159) {
    pRVar12->times_triggered = pRVar12->times_triggered + 1;
    pcVar15 = (char *)0x0;
    (*test_reporter->assert_true)
              (test_reporter,pRVar12->test_file,pRVar12->test_line,0,
               "Mocked function [%s] has an expectation that it will never be called, but it was",
               pRVar12->function);
LAB_0010a572:
    destroy_cgreen_vector(vector_00);
    destroy_cgreen_vector(vector);
  }
  else {
    if (successfully_mocked_calls == (CgreenVector *)0x0) {
      successfully_mocked_calls = create_cgreen_vector((_func_void_void_ptr *)0x0);
    }
    cgreen_vector_add(successfully_mocked_calls,pcVar15);
    pCVar14 = pRVar12->constraints;
    iVar7 = cgreen_vector_size(pCVar14);
    if (0 < iVar7) {
      iVar7 = 0;
      do {
        piVar18 = (int *)cgreen_vector_get(pCVar14,iVar7);
        iVar8 = *piVar18;
        if (iVar8 == 4) {
LAB_0010a755:
          iVar7 = piVar18[0x10];
          pcVar15 = *(char **)(piVar18 + 0x12);
          goto LAB_0010a78c;
        }
        if (iVar8 == 9) {
          iVar7 = piVar18[0x10];
          __src = *(void **)(piVar18 + 0x12);
          __size = *(size_t *)(piVar18 + 0x14);
          pcVar15 = (char *)malloc(__size);
          memcpy(pcVar15,__src,__size);
          goto LAB_0010a78c;
        }
        if (iVar8 == 6) goto LAB_0010a755;
        iVar7 = iVar7 + 1;
        iVar8 = cgreen_vector_size(pCVar14);
      } while (iVar7 < iVar8);
    }
    iVar7 = 0;
    pcVar15 = (char *)0x0;
LAB_0010a78c:
    iVar8 = cgreen_vector_size(pRVar12->constraints);
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        pCVar19 = (Constraint *)cgreen_vector_get(pRVar12->constraints,iVar8);
        if (pCVar19->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
          pRVar12->number_times_called = pRVar12->number_times_called + 1;
        }
        else {
          _Var6 = is_parameter(pCVar19);
          if ((_Var6) && (_Var6 = constraint_is_for_parameter_in(pCVar19,parameters), !_Var6)) {
            (*test_reporter->assert_true)
                      (test_reporter,pRVar12->test_file,pRVar12->test_line,0,
                       "Mocked function [%s] did not define a parameter named [%s]. Did you misspell it in the expectation or forget it in the mock\'s argument list?"
                       ,pRVar12->function,pCVar19->parameter_name);
            destroy_expectation_if_time_to_die(pRVar12);
            goto LAB_0010a572;
          }
        }
        iVar8 = iVar8 + 1;
        iVar9 = cgreen_vector_size(pRVar12->constraints);
      } while (iVar8 < iVar9);
    }
    iVar8 = test_reporter->failures;
    local_138 = pcVar15;
    iVar9 = cgreen_vector_size(vector);
    if (0 < iVar9) {
      iVar9 = 0;
      do {
        pcVar15 = (char *)cgreen_vector_get(vector,iVar9);
        pauVar20 = (undefined1 (*) [16])cgreen_vector_get(vector_00,iVar9);
        local_148 = *(size_t *)pauVar20[1];
        local_108 = *(undefined8 *)*pauVar20;
        uStack_100 = *(undefined8 *)(*pauVar20 + 8);
        local_158 = *pauVar20;
        local_f8 = local_148;
        iVar10 = cgreen_vector_size(pRVar12->constraints);
        if (0 < iVar10) {
          iVar10 = 0;
          do {
            pCVar19 = (Constraint *)cgreen_vector_get(pRVar12->constraints,iVar10);
            _Var6 = is_content_setting(pCVar19);
            if (((!_Var6) && (pCVar19->type != CGREEN_CALL_CONSTRAINT)) &&
               (_Var6 = constraint_is_not_for_parameter(pCVar19,pcVar15), !_Var6)) {
              CVar4.value_size = local_148;
              CVar4.type = local_158._0_4_;
              CVar4._4_4_ = local_158._4_4_;
              CVar4.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
              (*pCVar19->execute)(pCVar19,pRVar12->function,CVar4,pRVar12->test_file,
                                  pRVar12->test_line,test_reporter);
            }
            iVar10 = iVar10 + 1;
            iVar11 = cgreen_vector_size(pRVar12->constraints);
          } while (iVar10 < iVar11);
        }
        iVar9 = iVar9 + 1;
        iVar10 = cgreen_vector_size(vector);
      } while (iVar9 < iVar10);
    }
    if ((iVar8 == test_reporter->failures) && (iVar8 = cgreen_vector_size(vector), 0 < iVar8)) {
      iVar8 = 0;
      do {
        pcVar15 = (char *)cgreen_vector_get(vector,iVar8);
        pauVar20 = (undefined1 (*) [16])cgreen_vector_get(vector_00,iVar8);
        local_148 = *(size_t *)pauVar20[1];
        local_108 = *(undefined8 *)*pauVar20;
        uStack_100 = *(undefined8 *)(*pauVar20 + 8);
        local_158 = *pauVar20;
        local_f8 = local_148;
        iVar9 = cgreen_vector_size(pRVar12->constraints);
        if (0 < iVar9) {
          iVar9 = 0;
          do {
            pCVar19 = (Constraint *)cgreen_vector_get(pRVar12->constraints,iVar9);
            _Var6 = constraint_is_not_for_parameter(pCVar19,pcVar15);
            if ((!_Var6) && (pCVar19->type == CGREEN_CONTENT_SETTER_CONSTRAINT)) {
              CVar5.value_size = local_148;
              CVar5.type = local_158._0_4_;
              CVar5._4_4_ = local_158._4_4_;
              CVar5.value = (anon_union_8_4_d526cc82_for_value)local_158._8_8_;
              (*pCVar19->execute)(pCVar19,pRVar12->function,CVar5,pRVar12->test_file,
                                  pRVar12->test_line,test_reporter);
            }
            iVar9 = iVar9 + 1;
            iVar10 = cgreen_vector_size(pRVar12->constraints);
          } while (iVar9 < iVar10);
        }
        iVar8 = iVar8 + 1;
        iVar9 = cgreen_vector_size(vector);
      } while (iVar8 < iVar9);
    }
    iVar8 = cgreen_vector_size(pRVar12->constraints);
    pcVar15 = local_138;
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        piVar18 = (int *)cgreen_vector_get(pRVar12->constraints,iVar8);
        if (*piVar18 == 7) {
          local_158 = (undefined1  [16])0x0;
          local_148 = 0;
          (**(code **)(piVar18 + 8))
                    (piVar18,pRVar12->function,pRVar12->test_file,pRVar12->test_line,test_reporter);
        }
        iVar8 = iVar8 + 1;
        iVar9 = cgreen_vector_size(pRVar12->constraints);
      } while (iVar8 < iVar9);
    }
    destroy_cgreen_vector(vector);
    destroy_cgreen_vector(vector_00);
    pRVar12->times_triggered = pRVar12->times_triggered + 1;
    destroy_expectation_if_time_to_die(pRVar12);
    if (iVar7 == 2) {
      pcVar15 = (char *)box_double((double)pcVar15);
    }
  }
  return (intptr_t)pcVar15;
LAB_0010a419:
  vector_00 = create_cgreen_vector(free);
  if (0 < iVar7) {
    do {
      uVar21 = local_128 & 0xffffffff;
      if (uVar21 < 0x29) {
        local_128 = CONCAT44(local_128._4_4_,(int)local_128 + 8);
        piVar13 = (intptr_t *)(local_118 + uVar21);
      }
      else {
        piVar13 = local_120;
        local_120 = local_120 + 1;
      }
      make_cgreen_integer_value((CgreenValue *)local_158,*piVar13);
      value.value = (anon_union_8_4_d526cc82_for_value)local_148;
      value._0_8_ = local_158._8_8_;
      value.value_size = (size_t)vector_00;
      item = create_cgreen_value(value);
      cgreen_vector_add(vector_00,item);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  goto LAB_0010a4ad;
}

Assistant:

intptr_t mock_(TestReporter* test_reporter, const char *function, const char *mock_file, int mock_line, const char *parameters, ...) {
    va_list actuals;
    CgreenVector *actual_values;
    CgreenVector *parameter_names;
    int failures_before_read_only_constraints_executed;
    int failures_after_read_only_constraints_executed;
    CgreenValue stored_result;
    RecordedExpectation *expectation = find_expectation(function);

    parameter_names = create_vector_of_names(parameters);

    va_start(actuals, parameters);
    actual_values = create_vector_of_actuals(actuals, number_of_parameters_in(parameters));
    va_end(actuals);

    convert_boxed_doubles_to_cgreen_values(parameters, actual_values);

    if (expectation == NULL) {
        handle_missing_expectation_for(function, mock_file, mock_line, parameter_names, actual_values, test_reporter);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    if (is_never_call(expectation)) {
        expectation->times_triggered++;
        report_violated_never_call(test_reporter, expectation);
        destroy_cgreen_vector(actual_values);
        destroy_cgreen_vector(parameter_names);
        return 0;
    }

    ensure_successfully_mocked_calls_list_exists();
    cgreen_vector_add(successfully_mocked_calls, (void*)function);

    stored_result = stored_result_or_default_for(expectation->constraints);
    // FIXME: Should verify that return value is not a DOUBLE as `mock_()' can not
    // return them. There should also be a 'mock_double_()' which does the same except
    // returning a double.

    // First check all actual constraints for validity...
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (constraint->type == CGREEN_CALL_COUNTER_CONSTRAINT) {
            expectation->number_times_called++;
            continue;
        }

        if (!is_parameter(constraint))
            continue;

        if (!constraint_is_for_parameter_in(constraint, parameters)) {
            // if expectation parameter name isn't in parameter_names,
            // fail test and skip applying constraints unlikely to match
            report_mock_parameter_name_not_found(test_reporter, expectation, constraint->parameter_name);
            destroy_expectation_if_time_to_die(expectation);
            destroy_cgreen_vector(actual_values);
            destroy_cgreen_vector(parameter_names);

            return stored_result.value.integer_value;
        }
    }

    // Now we can do the read-only constraints.  If read-only
    // constraints aren't matching, content-setting ones might corrupt
    // memory so apply read-only ones first, and if they don't fail,
    // then do the deeper constraints
    failures_before_read_only_constraints_executed = test_reporter->failures;

    for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
        const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
        CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
        apply_any_read_only_parameter_constraints(expectation, parameter_name, actual, test_reporter);
    }

    failures_after_read_only_constraints_executed = test_reporter->failures;

    // And now we can do the content setting constraints...
    // FIXME: this comparison doesn't work because only parent
    //        processes' pass/fail counts are updated, and even then
    //        only once they read from the pipe
    if (failures_before_read_only_constraints_executed == failures_after_read_only_constraints_executed) {
        for (int i = 0; i < cgreen_vector_size(parameter_names); i++) {
            const char* parameter_name = (const char*)cgreen_vector_get(parameter_names, i);
            CgreenValue actual = *(CgreenValue*)cgreen_vector_get(actual_values, i);
            apply_any_content_setting_parameter_constraints(expectation, parameter_name, actual, test_reporter);
        }
    }

    // And finally run all side effects
    for (int i = 0; i < cgreen_vector_size(expectation->constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(expectation->constraints, i);

        if (is_side_effect_constraint(constraint)) {
            apply_side_effect(test_reporter, expectation, constraint);
            continue;
        }
    }



    destroy_cgreen_vector(parameter_names);
    destroy_cgreen_vector(actual_values);

    expectation->times_triggered++;
    destroy_expectation_if_time_to_die(expectation);

    if (stored_result.type == CGREEN_DOUBLE) {
#ifdef FUTURE
        /* TODO: for some future version we should ensure that the
           user is not trying to return a double through 'mock()' when
           there is a 'mock_double()' available, which there isn't
           yet. So then

               return unbox_double(mock(...));

           should be replaced by

               return mock_double(...);
        */
        test_reporter->assert_true(test_reporter,
                                   mock_file,
                                   mock_line,
                                   false,
                                   "Mocked function [%s] have a 'will_return_double()' expectation, "
                                   "but 'mock()' cannot return doubles; Use 'mock_double()' instead",
                                   function);
        /* But we'll return it anyway, whatever it becomes is what he will get... */
        return stored_result.value.double_value;
#else
        /* ... but for now return a boxed double since the user is probably using

               return unbox_double(mock(...));

           as is the standard way in 1.x
        */
        return box_double(stored_result.value.double_value);
#endif
    } else
        return stored_result.value.integer_value;
}